

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O3

int __thiscall QtMWidgets::StepperPrivate::bound(StepperPrivate *this,int val)

{
  int iVar1;
  int v;
  
  iVar1 = this->minimum;
  if (iVar1 <= val) {
    if ((this->maximum < val) && (val = this->maximum, this->wrapping != false)) {
      val = iVar1;
    }
    return val;
  }
  if (this->wrapping != false) {
    iVar1 = this->maximum;
  }
  return iVar1;
}

Assistant:

int
StepperPrivate::bound( int val ) const
{
	int v = val;

	if( v < minimum )
		v = wrapping ? maximum : minimum;
	else if( v > maximum )
		v = wrapping ? minimum : maximum;

	return v;
}